

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastSet.h
# Opt level: O2

void __thiscall CFastSet<int>::GetSet(CFastSet<int> *this,CSet *set)

{
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_40;
  
  ::CFastSet::operator_cast_to_set((CSet *)&local_40,(CFastSet *)this);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::operator=
            (&set->_M_t,&local_40);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_40);
  return;
}

Assistant:

void GetSet(CSet* set) const { *set = *this; }